

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_avcc.cpp
# Opt level: O3

int write_avcc(avcc_t *avcc,h264_stream_t *h,bs_t *b)

{
  byte *pbVar1;
  nal_t *pnVar2;
  int iVar3;
  uint8_t *puVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  bool bVar10;
  
  iVar3 = b->bits_left;
  if ((iVar3 == 8) && (b->p < b->end)) {
    *b->p = '\x01';
    b->p = b->p + 1;
    iVar3 = b->bits_left;
  }
  else {
    iVar5 = 7;
    do {
      iVar3 = iVar3 + -1;
      b->bits_left = iVar3;
      pbVar1 = b->p;
      if (pbVar1 < b->end) {
        *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
        *b->p = *b->p | (byte)((1U >> ((byte)iVar5 & 0x1f)) << ((byte)b->bits_left & 0x1f));
        iVar3 = b->bits_left;
      }
      if (iVar3 == 0) {
        b->p = b->p + 1;
        b->bits_left = 8;
        iVar3 = 8;
      }
      bVar10 = iVar5 != 0;
      iVar5 = iVar5 + -1;
    } while (bVar10);
  }
  uVar6 = avcc->AVCProfileIndication;
  if ((iVar3 == 8) && (b->p < b->end)) {
    *b->p = (uint8_t)uVar6;
    b->p = b->p + 1;
    iVar3 = b->bits_left;
  }
  else {
    uVar8 = 7;
    do {
      iVar3 = iVar3 + -1;
      b->bits_left = iVar3;
      pbVar1 = b->p;
      if (pbVar1 < b->end) {
        *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
        *b->p = *b->p | ((uVar6 >> (uVar8 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
        iVar3 = b->bits_left;
      }
      if (iVar3 == 0) {
        b->p = b->p + 1;
        b->bits_left = 8;
        iVar3 = 8;
      }
      bVar10 = uVar8 != 0;
      uVar8 = uVar8 - 1;
    } while (bVar10);
  }
  uVar6 = avcc->profile_compatibility;
  if ((iVar3 == 8) && (b->p < b->end)) {
    *b->p = (uint8_t)uVar6;
    b->p = b->p + 1;
    iVar3 = b->bits_left;
  }
  else {
    uVar8 = 7;
    do {
      iVar3 = iVar3 + -1;
      b->bits_left = iVar3;
      pbVar1 = b->p;
      if (pbVar1 < b->end) {
        *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
        *b->p = *b->p | ((uVar6 >> (uVar8 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
        iVar3 = b->bits_left;
      }
      if (iVar3 == 0) {
        b->p = b->p + 1;
        b->bits_left = 8;
        iVar3 = 8;
      }
      bVar10 = uVar8 != 0;
      uVar8 = uVar8 - 1;
    } while (bVar10);
  }
  uVar6 = avcc->AVCLevelIndication;
  if ((iVar3 == 8) && (b->p < b->end)) {
    *b->p = (uint8_t)uVar6;
    b->p = b->p + 1;
    iVar3 = b->bits_left;
  }
  else {
    uVar8 = 7;
    do {
      iVar3 = iVar3 + -1;
      b->bits_left = iVar3;
      pbVar1 = b->p;
      if (pbVar1 < b->end) {
        *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
        *b->p = *b->p | ((uVar6 >> (uVar8 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
        iVar3 = b->bits_left;
      }
      if (iVar3 == 0) {
        b->p = b->p + 1;
        b->bits_left = 8;
        iVar3 = 8;
      }
      bVar10 = uVar8 != 0;
      uVar8 = uVar8 - 1;
    } while (bVar10);
  }
  uVar6 = 5;
  do {
    iVar3 = iVar3 + -1;
    b->bits_left = iVar3;
    pbVar1 = b->p;
    if (pbVar1 < b->end) {
      *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
      *b->p = *b->p | ((0x3fU >> (uVar6 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
      iVar3 = b->bits_left;
    }
    if (iVar3 == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
      iVar3 = 8;
    }
    bVar10 = uVar6 != 0;
    uVar6 = uVar6 - 1;
  } while (bVar10);
  uVar6 = avcc->lengthSizeMinusOne;
  uVar8 = 1;
  do {
    iVar3 = iVar3 + -1;
    b->bits_left = iVar3;
    pbVar1 = b->p;
    if (pbVar1 < b->end) {
      *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
      *b->p = *b->p | ((uVar6 >> (uVar8 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
      iVar3 = b->bits_left;
    }
    if (iVar3 == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
      iVar3 = 8;
    }
    bVar10 = uVar8 != 0;
    uVar8 = uVar8 - 1;
  } while (bVar10);
  uVar6 = 2;
  do {
    iVar3 = iVar3 + -1;
    b->bits_left = iVar3;
    pbVar1 = b->p;
    if (pbVar1 < b->end) {
      *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
      *b->p = *b->p | ((7U >> (uVar6 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
      iVar3 = b->bits_left;
    }
    if (iVar3 == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
      iVar3 = 8;
    }
    bVar10 = uVar6 != 0;
    uVar6 = uVar6 - 1;
  } while (bVar10);
  uVar6 = avcc->numOfSequenceParameterSets;
  uVar8 = 4;
  do {
    iVar3 = iVar3 + -1;
    b->bits_left = iVar3;
    pbVar1 = b->p;
    if (pbVar1 < b->end) {
      *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
      *b->p = *b->p | ((uVar6 >> (uVar8 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
      iVar3 = b->bits_left;
    }
    if (iVar3 == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
      iVar3 = 8;
    }
    bVar10 = uVar8 != 0;
    uVar8 = uVar8 - 1;
  } while (bVar10);
  if (0 < avcc->numOfSequenceParameterSets) {
    lVar9 = 0;
    do {
      puVar4 = (uint8_t *)malloc(0x400);
      pnVar2 = h->nal;
      pnVar2->nal_ref_idc = 3;
      pnVar2->nal_unit_type = 7;
      h->sps = avcc->sps_table[lVar9];
      uVar6 = write_nal_unit(h,puVar4,0x400);
      if (-1 < (int)uVar6) {
        iVar3 = b->bits_left;
        uVar8 = 0xf;
        do {
          iVar3 = iVar3 + -1;
          b->bits_left = iVar3;
          pbVar1 = b->p;
          if (pbVar1 < b->end) {
            *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
            *b->p = *b->p | ((uVar6 >> (uVar8 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
            iVar3 = b->bits_left;
          }
          if (iVar3 == 0) {
            b->p = b->p + 1;
            b->bits_left = 8;
            iVar3 = 8;
          }
          bVar10 = uVar8 != 0;
          uVar8 = uVar8 - 1;
        } while (bVar10);
        lVar7 = (long)b->end - (long)b->p;
        uVar8 = (uint)lVar7;
        if ((long)(ulong)uVar6 <= lVar7) {
          uVar8 = uVar6;
        }
        if ((int)uVar8 < 1) {
          uVar8 = 0;
        }
        memcpy(b->p,puVar4,(ulong)uVar8);
        b->p = b->p + uVar6;
      }
      free(puVar4);
      lVar9 = lVar9 + 1;
    } while (lVar9 < avcc->numOfSequenceParameterSets);
    iVar3 = b->bits_left;
  }
  uVar6 = avcc->numOfPictureParameterSets;
  uVar8 = 7;
  do {
    iVar3 = iVar3 + -1;
    b->bits_left = iVar3;
    pbVar1 = b->p;
    if (pbVar1 < b->end) {
      *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
      *b->p = *b->p | ((uVar6 >> (uVar8 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
      iVar3 = b->bits_left;
    }
    if (iVar3 == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
      iVar3 = 8;
    }
    bVar10 = uVar8 != 0;
    uVar8 = uVar8 - 1;
  } while (bVar10);
  if (0 < avcc->numOfPictureParameterSets) {
    lVar9 = 0;
    do {
      puVar4 = (uint8_t *)malloc(0x400);
      pnVar2 = h->nal;
      pnVar2->nal_ref_idc = 3;
      pnVar2->nal_unit_type = 8;
      h->pps = avcc->pps_table[lVar9];
      uVar6 = write_nal_unit(h,puVar4,0x400);
      if (-1 < (int)uVar6) {
        iVar3 = b->bits_left;
        uVar8 = 0xf;
        do {
          iVar3 = iVar3 + -1;
          b->bits_left = iVar3;
          pbVar1 = b->p;
          if (pbVar1 < b->end) {
            *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
            *b->p = *b->p | ((uVar6 >> (uVar8 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
            iVar3 = b->bits_left;
          }
          if (iVar3 == 0) {
            b->p = b->p + 1;
            b->bits_left = 8;
            iVar3 = 8;
          }
          bVar10 = uVar8 != 0;
          uVar8 = uVar8 - 1;
        } while (bVar10);
        lVar7 = (long)b->end - (long)b->p;
        uVar8 = (uint)lVar7;
        if ((long)(ulong)uVar6 <= lVar7) {
          uVar8 = uVar6;
        }
        if ((int)uVar8 < 1) {
          uVar8 = 0;
        }
        memcpy(b->p,puVar4,(ulong)uVar8);
        b->p = b->p + uVar6;
      }
      free(puVar4);
      lVar9 = lVar9 + 1;
    } while (lVar9 < avcc->numOfPictureParameterSets);
  }
  iVar3 = -1;
  if (b->p <= b->end) {
    iVar3 = (int)b->p - *(int *)&b->start;
  }
  return iVar3;
}

Assistant:

int write_avcc(avcc_t* avcc, h264_stream_t* h, bs_t* b)
{
    bs_write_u8(b, 1); // configurationVersion = 1;
    bs_write_u8(b, avcc->AVCProfileIndication);
    bs_write_u8(b, avcc->profile_compatibility);
    bs_write_u8(b, avcc->AVCLevelIndication);
    bs_write_u(b, 6, 0x3F); // reserved = '111111'b;
    bs_write_u(b, 2, avcc->lengthSizeMinusOne);
    bs_write_u(b, 3, 0x07); // reserved = '111'b;

    bs_write_u(b, 5, avcc->numOfSequenceParameterSets);
    for (int i = 0; i < avcc->numOfSequenceParameterSets; i++)
    {
        int max_len = 1024; // FIXME
        uint8_t* buf = (uint8_t*)malloc(max_len);
        h->nal->nal_ref_idc = 3; // NAL_REF_IDC_PRIORITY_HIGHEST;
        h->nal->nal_unit_type = NAL_UNIT_TYPE_SPS;
        h->sps = avcc->sps_table[i];
        int len = write_nal_unit(h, buf, max_len);
        if (len < 0) { free(buf); continue; } // TODO report errors
        int sequenceParameterSetLength = len;
        bs_write_u(b, 16, sequenceParameterSetLength);
        bs_write_bytes(b, buf, len);
        free(buf);
    }

    bs_write_u(b, 8, avcc->numOfPictureParameterSets);
    for (int i = 0; i < avcc->numOfPictureParameterSets; i++)
    {
        int max_len = 1024; // FIXME
        uint8_t* buf = (uint8_t*)malloc(max_len);
        h->nal->nal_ref_idc = 3; // NAL_REF_IDC_PRIORITY_HIGHEST;
        h->nal->nal_unit_type = NAL_UNIT_TYPE_PPS;
        h->pps = avcc->pps_table[i];
        int len = write_nal_unit(h, buf, max_len);
        if (len < 0) { free(buf); continue; } // TODO report errors
        int pictureParameterSetLength = len;
        bs_write_u(b, 16, pictureParameterSetLength);
        bs_write_bytes(b, buf, len);
        free(buf);
    }

    if (bs_overrun(b)) { return -1; }
    return bs_pos(b);
}